

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.h
# Opt level: O0

void __thiscall libDAI::FactorGraph::FactorGraph(FactorGraph *this,FactorGraph *x)

{
  GraphicalModel *in_RSI;
  GraphicalModel *in_RDI;
  BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *in_stack_00000008;
  BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *in_stack_00000010;
  map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  *in_stack_ffffffffffffffc8;
  
  GraphicalModel::GraphicalModel(in_RDI,in_RSI);
  in_RDI->_vptr_GraphicalModel = (_func_int **)&PTR__FactorGraph_00d4d790;
  BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::BipartiteGraph
            (in_stack_00000010,in_stack_00000008);
  std::
  map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  ::map((map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
         *)in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

FactorGraph( const FactorGraph & x ) : GraphicalModel(x), _fg(x._fg), _backupFactors(x._backupFactors) {}